

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O2

void __thiscall QPainter::setPen(QPainter *this,QColor *color)

{
  uint *puVar1;
  _Head_base<0UL,_QPainterPrivate_*,_false> _Var2;
  undefined8 uVar3;
  QColor color_00;
  bool bVar4;
  long in_FS_OFFSET;
  QColor local_38;
  undefined4 uStack_28;
  undefined4 local_24;
  char *local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  _Var2._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if ((tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>)
      *(tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor> *)
       &((_Var2._M_head_impl)->engine)._M_t ==
      (__uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>)0x0) {
    local_38.cspec = Hsv;
    local_24 = 0;
    local_38.ct._0_4_ = 0;
    local_38.ct._4_4_ = 0;
    local_38._12_4_ = 0;
    uStack_28 = 0;
    local_20 = "default";
    QMessageLogger::warning((char *)&local_38,"QPainter::setPen: Painter not active");
  }
  else {
    local_38.cspec = 0xaaaaaaaa;
    local_38.ct._0_4_ = 0xaaaaaaaa;
    local_38.ct._4_4_ = 0xaaaaaaaa;
    local_38._12_4_ = 0xaaaaaaaa;
    if (color->cspec == Invalid) {
      QColor::QColor(&local_38,black);
    }
    else {
      uVar3 = *(undefined8 *)((long)&color->ct + 4);
      local_38.cspec = (Spec)*(undefined8 *)color;
      local_38.ct._0_4_ = (undefined4)((ulong)*(undefined8 *)color >> 0x20);
      local_38.ct._4_4_ = (undefined4)uVar3;
      local_38._12_4_ = SUB84((ulong)uVar3 >> 0x20,0);
    }
    bVar4 = ::operator==((QPen *)((long)((_Var2._M_head_impl)->state)._M_t + 0x40),&local_38);
    if (!bVar4) {
      color_00.ct._0_4_ = local_38.ct._0_4_;
      color_00.cspec = local_38.cspec;
      color_00.ct._4_4_ = local_38.ct._4_4_;
      color_00._12_4_ = local_38._12_4_;
      QPen::operator=((QPen *)((long)((_Var2._M_head_impl)->state)._M_t + 0x40),color_00);
      if ((_Var2._M_head_impl)->extended == (QPaintEngineEx *)0x0) {
        puVar1 = (uint *)((long)((_Var2._M_head_impl)->state)._M_t + 8);
        *puVar1 = *puVar1 | 1;
      }
      else {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->extended->super_QPaintEngine + 0x108))();
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::setPen(const QColor &color)
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::setPen(), color=%04x\n", color.rgb());
#endif
    Q_D(QPainter);
    if (!d->engine) {
        qWarning("QPainter::setPen: Painter not active");
        return;
    }

    const QColor actualColor = color.isValid() ? color : QColor(Qt::black);
    if (d->state->pen == actualColor)
        return;

    d->state->pen = actualColor;
    if (d->extended)
        d->extended->penChanged();
    else
        d->state->dirtyFlags |= QPaintEngine::DirtyPen;
}